

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O1

RenderContext *
glu::createDefaultRenderContext(Platform *platform,CommandLine *cmdLine,ApiType apiType)

{
  int iVar1;
  char *pcVar2;
  RenderContext *pRVar3;
  NotSupportedError *this;
  long *plVar4;
  long *plVar5;
  uint uVar6;
  long lVar7;
  pointer __rhs;
  bool bVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flagNames;
  RenderConfig config;
  allocator<char> local_109;
  Platform *local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  RenderConfig local_68;
  
  local_68.type.super_ApiType.m_bits = (ApiType)0x300;
  local_68.width = -1;
  local_68.height = -1;
  local_68.surfaceType = SURFACETYPE_DONT_CARE;
  local_68.windowVisibility = VISIBILITY_VISIBLE;
  local_68.id = -1;
  local_68.redBits = -1;
  local_68.greenBits = -1;
  local_68.blueBits = -1;
  local_68.alphaBits = -1;
  local_68.depthBits = -1;
  local_68.stencilBits = -1;
  local_68.numSamples = -1;
  local_68.resetNotificationStrategy = RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED;
  pcVar2 = tcu::CommandLine::getGLContextFlags(cmdLine);
  if (pcVar2 == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    pcVar2 = tcu::CommandLine::getGLContextFlags(cmdLine);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar2,&local_109);
    de::splitString(&local_100,&local_c8,',');
    if (local_100.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_100.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      __rhs = local_100.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_108 = platform;
      do {
        lVar7 = 0;
        do {
          iVar1 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar1 == 0) {
            uVar6 = uVar6 | *(uint *)((long)&DAT_00d4a778 + lVar7);
            bVar8 = lVar7 == 0x20;
            goto LAB_00a34872;
          }
          lVar7 = lVar7 + 0x10;
        } while (lVar7 == 0x10);
        bVar8 = true;
LAB_00a34872:
        if (bVar8) {
          tcu::print("ERROR: Unrecognized GL context flag \'%s\'\n",(__rhs->_M_dataplus)._M_p);
          tcu::print("Supported GL context flags:\n");
          lVar7 = 0;
          do {
            tcu::print("  %s\n",*(undefined8 *)
                                 ((long)&parseContextFlags(std::__cxx11::string_const&)::s_flagMap +
                                 lVar7));
            lVar7 = lVar7 + 0x10;
          } while (lVar7 == 0x10);
          this = (NotSupportedError *)__cxa_allocate_exception(0x38);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Unknown GL context flag \'","");
          std::operator+(&local_88,&local_a8,__rhs);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
          local_e8 = (long *)*plVar4;
          plVar5 = plVar4 + 2;
          if (local_e8 == plVar5) {
            local_d8 = *plVar5;
            lStack_d0 = plVar4[3];
            local_e8 = &local_d8;
          }
          else {
            local_d8 = *plVar5;
          }
          local_e0 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          tcu::NotSupportedError::NotSupportedError
                    (this,(char *)local_e8,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                     ,0x7f);
          __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        __rhs = __rhs + 1;
      } while (__rhs != local_100.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      uVar6 = uVar6 << 10;
      platform = local_108;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_68.type.super_ApiType.m_bits = (ApiType)(ApiType)(uVar6 | apiType.m_bits);
  parseRenderConfig(&local_68,cmdLine);
  pRVar3 = createRenderContext(platform,cmdLine,&local_68);
  return pRVar3;
}

Assistant:

RenderContext* createDefaultRenderContext (tcu::Platform& platform, const tcu::CommandLine& cmdLine, ApiType apiType)
{
	RenderConfig	config;
	ContextFlags	ctxFlags	= ContextFlags(0);

	if (cmdLine.getGLContextFlags())
		ctxFlags = parseContextFlags(cmdLine.getGLContextFlags());

	config.type = glu::ContextType(apiType, ctxFlags);
	parseRenderConfig(&config, cmdLine);

	return createRenderContext(platform, cmdLine, config);
}